

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTParsePacket.cpp
# Opt level: O2

bool readFile(char *path,uint8 **buffer,size_t *size)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint8 *__ptr;
  size_t sVar3;
  bool bVar4;
  ScopeFile f;
  
  __stream = fopen(path,"rb");
  f.f = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    bVar4 = false;
    iVar1 = fseek(__stream,0,2);
    if (iVar1 != 0) goto LAB_001075e0;
    sVar2 = ftell(__stream);
    *size = sVar2;
    bVar4 = false;
    iVar1 = fseek(__stream,0,0);
    if (iVar1 != 0) goto LAB_001075e0;
    sVar3 = *size;
    if (0xffffffffffdfffff < sVar3 - 0x200001) {
      __ptr = (uint8 *)operator_new__(sVar3 + 1);
      *buffer = __ptr;
      sVar3 = fread(__ptr,1,sVar3,__stream);
      bVar4 = (long)(int)sVar3 == *size;
      goto LAB_001075e0;
    }
  }
  bVar4 = false;
LAB_001075e0:
  ScopeFile::~ScopeFile(&f);
  return bVar4;
}

Assistant:

bool readFile(const char * path, uint8 *& buffer, size_t & size)
{
    ScopeFile f(path);
    if (!f) return false;
    if (fseek(f, 0,  SEEK_END)) return false;
    size = (size_t)ftell(f);
    if (fseek(f, 0, SEEK_SET)) return false;

    if (!size || size > 2048*1024) return false;
    buffer = new uint8[size+1];
    if (!buffer) return false;

    int r = fread(buffer, 1, size, f);
    return r == size;
}